

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.hpp
# Opt level: O3

detected_language *
csv::icu::encoding::TextEncodingForFile(detected_language *__return_storage_ptr__,char *file)

{
  FILE *__stream;
  size_t length;
  UErrorCode u_glob_status;
  char buf [4096];
  int local_102c;
  char local_1028 [4104];
  
  local_102c = 0;
  u_init_70(&local_102c);
  if ((local_102c < 1) && (__stream = fopen(file,"rb"), __stream != (FILE *)0x0)) {
    length = fread(local_1028,1,0x1000,__stream);
    fclose(__stream);
    TextEncodingForData(__return_storage_ptr__,local_1028,length);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->language)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->language)._M_string_length = 0;
  (__return_storage_ptr__->language).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->language).field_2 + 8) = 0;
  (__return_storage_ptr__->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->confidence = 0;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->language)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->language).field_2;
  (__return_storage_ptr__->language).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

detected_language TextEncodingForFile(const char* file) {
		UErrorCode u_glob_status = U_ZERO_ERROR;
		FILE* fp(0);

		u_init(&u_glob_status);
		if (U_SUCCESS(u_glob_status) &&
			(fp = fopen(file, "rb")) != NULL) {
			// Read (up to) the first 4k.  It should give us enough to detect the file
			char buf[4096];
			size_t read = fread(buf, 1, 4096, fp);

			fclose(fp);
			return TextEncodingForData(buf, read);
		}
		return detected_language();
	}